

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshal.c
# Opt level: O2

ptrlen BinarySource_get_chomped_line(BinarySource *src)

{
  void *__s;
  size_t sVar1;
  void *pvVar2;
  size_t sVar3;
  void *pvVar4;
  size_t sVar5;
  ptrlen pVar6;
  
  pvVar4 = src->data;
  sVar5 = src->pos;
  __s = (void *)((long)pvVar4 + sVar5);
  if (src->err == BSE_NO_ERROR) {
    sVar1 = src->len;
    pvVar2 = memchr(__s,10,sVar1 - sVar5);
    sVar3 = (long)pvVar2 + (sVar5 - (long)__s) + 1;
    if (pvVar2 == (void *)0x0) {
      sVar3 = sVar1;
    }
    src->pos = sVar3;
    pvVar4 = (void *)((long)pvVar4 + sVar3);
    if (((long)sVar5 < (long)sVar3) && (*(char *)((long)pvVar4 + -1) == '\n')) {
      pvVar4 = (void *)((long)pvVar4 + -1);
    }
    if ((__s < pvVar4) && (*(char *)((long)pvVar4 + -1) == '\r')) {
      pvVar4 = (void *)((long)pvVar4 + -1);
    }
    sVar5 = (long)pvVar4 - (long)__s;
  }
  else {
    sVar5 = 0;
  }
  pVar6.len = sVar5;
  pVar6.ptr = __s;
  return pVar6;
}

Assistant:

ptrlen BinarySource_get_chomped_line(BinarySource *src)
{
    const char *start, *end;

    if (src->err)
        return make_ptrlen(here, 0);

    start = here;
    end = memchr(start, '\n', src->len - src->pos);
    if (end)
        advance(end + 1 - start);
    else
        advance(src->len - src->pos);
    end = here;

    if (end > start && end[-1] == '\n')
        end--;
    if (end > start && end[-1] == '\r')
        end--;

    return make_ptrlen(start, end - start);
}